

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,unsigned_long value,
          basic_format_specs<char> *specs)

{
  bool bVar1;
  long lVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  size_t sVar4;
  char *pcVar5;
  unsigned_long uVar6;
  ulong uVar7;
  long lVar8;
  anon_class_16_2_92d121e5 write;
  char buffer [17];
  anon_class_16_2_92d121e5 local_48;
  char local_38 [32];
  
  uVar6 = value;
  lVar2 = 0;
  do {
    lVar8 = lVar2;
    bVar1 = 0xf < uVar6;
    uVar6 = uVar6 >> 4;
    lVar2 = lVar8 + 1;
  } while (bVar1);
  local_48.num_digits = (int)(lVar8 + 1);
  local_48.value = value;
  if (specs == (basic_format_specs<char> *)0x0) {
    sVar4 = (out.container)->size_;
    uVar7 = sVar4 + 1;
    if ((out.container)->capacity_ < uVar7) {
      (**(out.container)->_vptr_buffer)(out.container);
      sVar4 = (out.container)->size_;
      uVar7 = sVar4 + 1;
    }
    (out.container)->size_ = uVar7;
    (out.container)->ptr_[sVar4] = '0';
    sVar4 = (out.container)->size_;
    uVar7 = sVar4 + 1;
    if ((out.container)->capacity_ < uVar7) {
      (**(out.container)->_vptr_buffer)(out.container);
      sVar4 = (out.container)->size_;
      uVar7 = sVar4 + 1;
    }
    pcVar5 = local_38 + lVar8;
    (out.container)->size_ = uVar7;
    (out.container)->ptr_[sVar4] = 'x';
    do {
      *pcVar5 = "0123456789abcdef"[(uint)value & 0xf];
      pcVar5 = pcVar5 + -1;
      bVar1 = 0xf < value;
      value = value >> 4;
    } while (bVar1);
    bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      (local_38,local_38 + lVar8 + 1,out);
  }
  else {
    bVar3 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long,fmt::v7::basic_format_specs<char>const*)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_&>
                      (out,specs,lVar8 + 3U,lVar8 + 3U,&local_48);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar3.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}